

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode deflate_init_writer(Curl_easy *data,contenc_writer *writer)

{
  int iVar1;
  z_stream *z;
  zlib_writer *zp;
  contenc_writer *writer_local;
  Curl_easy *data_local;
  
  if (writer->downstream == (contenc_writer *)0x0) {
    data_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    writer[5].downstream = (contenc_writer *)zalloc_cb;
    writer[6].handler = (content_encoding *)zfree_cb;
    iVar1 = cm_zlib_inflateInit_((z_streamp)&writer[1].downstream,"1.2.12",0x70);
    if (iVar1 == 0) {
      *(undefined4 *)&writer[1].handler = 1;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      data_local._4_4_ = process_zlib_error(data,(z_stream *)&writer[1].downstream);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode deflate_init_writer(struct Curl_easy *data,
                                    struct contenc_writer *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit(z) != Z_OK)
    return process_zlib_error(data, z);
  zp->zlib_init = ZLIB_INIT;
  return CURLE_OK;
}